

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O2

void __thiscall ASDCP::MXF::ISO8String::~ISO8String(ISO8String *this)

{
  std::__cxx11::string::~string((string *)&this->super_string);
  operator_delete(this,0x28);
  return;
}

Assistant:

~ISO8String() {}